

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convertable_log.c
# Opt level: O0

int mpt_convertable_log(mpt_convertable *dest,char *fcn,int type,char *fmt,...)

{
  char in_AL;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_108 [32];
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  int local_54;
  mpt_logger *pmStack_50;
  int ret;
  mpt_logger *log;
  va_list va;
  char *fmt_local;
  int type_local;
  char *fcn_local;
  mpt_convertable *dest_local;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Qa;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  pmStack_50 = (mpt_logger *)0x0;
  local_54 = 0;
  local_e8 = in_R8;
  local_e0 = in_R9;
  va[0].reg_save_area = fmt;
  if ((dest == (mpt_convertable *)0x0) &&
     (pmStack_50 = mpt_log_default(), pmStack_50 == (mpt_logger *)0x0)) {
    return 0;
  }
  va[0].overflow_arg_area = local_108;
  va[0]._0_8_ = &stack0x00000008;
  log._4_4_ = 0x30;
  log._0_4_ = 0x20;
  if (dest == (mpt_convertable *)0x0) {
    local_54 = (*pmStack_50->_vptr->log)
                         (pmStack_50,fcn,type,(char *)va[0].reg_save_area,(__va_list_tag *)&log);
  }
  else {
    local_54 = mpt_convertable_vlog
                         (dest,fcn,type | 0xb00,(char *)va[0].reg_save_area,(__va_list_tag *)&log);
  }
  return local_54;
}

Assistant:

int mpt_convertable_log(MPT_INTERFACE(convertable) *dest, const char *fcn, int type, const char *fmt, ...)
{
	va_list va;
	MPT_INTERFACE(logger) *log = 0;
	int ret = 0;
	
	if (!dest && !(log  = mpt_log_default())) {
		return 0;
	}
	va_start(va, fmt);
	if (dest) {
		ret = mpt_convertable_vlog(dest, fcn, type | MPT_ENUM(LogFunction) | MPT_ENUM(LogPretty), fmt, va);
	} else {
		ret = log->_vptr->log(log, fcn, type, fmt, va);
	}
	va_end(va);
	return ret;
}